

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

void __thiscall
slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::
ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor::
handle(slang::syntax::NameSyntax_const__(Visitor *this,NameSyntax *nameSyntax)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Scope *pSVar2;
  bitmask<slang::ast::ASTFlags> flags_00;
  SyntaxNode *in_RSI;
  long *in_RDI;
  ASTContext ctx;
  LookupResult result;
  bitmask<slang::ast::LookupFlags> flags;
  undefined8 in_stack_fffffffffffffcf8;
  LookupFlags r;
  IdentifierNameSyntax **item;
  LookupResult *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffd10;
  LookupResult *in_stack_fffffffffffffd38;
  bitmask<slang::ast::ASTFlags> local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  long local_268;
  bitmask<slang::ast::LookupFlags> local_24;
  bitmask<slang::ast::ASTFlags> local_20;
  bitmask<slang::ast::LookupFlags> local_14;
  SyntaxNode *local_10;
  
  r = (LookupFlags)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  if (in_RSI->kind == IdentifierName) {
    local_10 = in_RSI;
    bitmask<slang::ast::LookupFlags>::bitmask(&local_14,NoUndeclaredError);
    pSVar2 = (Scope *)(*in_RDI + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_20,BindInstantiation);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      (in_stack_fffffffffffffd10,
                       (bitmask<slang::ast::ASTFlags> *)
                       CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
    if (bVar1) {
      local_24 = ast::operator|((LookupFlags)in_stack_fffffffffffffd00,r);
      bitmask<slang::ast::LookupFlags>::operator|=(&local_14,&local_24);
    }
    LookupResult::LookupResult(in_stack_fffffffffffffd00);
    flags_00.m_bits =
         (underlying_type)
         not_null<const_slang::ast::Scope_*>::operator*
                   ((not_null<const_slang::ast::Scope_*> *)0x9a6b30);
    local_2b8 = LookupLocation::max;
    uStack_2b0 = DAT_0101c840;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_2c0,None);
    lookupLocation._8_8_ = in_RDI;
    lookupLocation.scope = pSVar2;
    ASTContext::ASTContext
              ((ASTContext *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (Scope *)in_stack_fffffffffffffd00,lookupLocation,flags_00);
    Lookup::name((NameSyntax *)
                 result.selectors.
                 super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 .firstElement._16_8_,
                 (ASTContext *)
                 result.selectors.
                 super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 .firstElement._8_8_,
                 (bitmask<slang::ast::LookupFlags>)
                 result.selectors.
                 super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 .firstElement._28_4_,
                 (LookupResult *)
                 result.selectors.
                 super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 .firstElement._0_8_);
    if ((local_268 == 0) && (bVar1 = LookupResult::hasError(in_stack_fffffffffffffd38), !bVar1)) {
      item = (IdentifierNameSyntax **)in_RDI[1];
      in_stack_fffffffffffffd00 =
           (LookupResult *)
           slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(local_10);
      SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::push_back
                ((SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                 in_stack_fffffffffffffd00,item);
    }
    LookupResult::~LookupResult(in_stack_fffffffffffffd00);
  }
  return;
}

Assistant:

void handle(const NameSyntax& nameSyntax) {
            if (nameSyntax.kind != SyntaxKind::IdentifierName)
                return;

            bitmask<LookupFlags> flags = LookupFlags::NoUndeclaredError;
            if (context.flags.has(ASTFlags::BindInstantiation))
                flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

            LookupResult result;
            ASTContext ctx(*context.scope, LookupLocation::max);
            Lookup::name(nameSyntax, ctx, flags, result);

            SLANG_ASSERT(!result.flags.has(LookupResultFlags::IsHierarchical));

            if (!result.found && !result.hasError())
                results.push_back(&nameSyntax.as<IdentifierNameSyntax>());
        }